

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListHasAnyOrAllBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  ScalarFunction *pSVar4;
  undefined1 auVar5 [8];
  element_type *peVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  reference pvVar11;
  pointer pEVar12;
  pointer pEVar13;
  reference pvVar14;
  LogicalType *pLVar15;
  LogicalType *pLVar16;
  ParameterNotResolvedException *this_01;
  BinderException *this_02;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  LogicalType common_child;
  undefined1 local_100 [8];
  element_type *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  undefined1 local_e0 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_d0;
  ScalarFunction *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  LogicalType local_b0;
  ClientContext *local_98;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  local_c8 = bound_function;
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  local_d0._M_head_impl =
       (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_100,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_d0);
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  auVar5 = local_100;
  local_100 = (undefined1  [8])0x0;
  _Var1._M_head_impl =
       (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar5;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_100 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_100 + 8))();
  }
  local_100 = (undefined1  [8])0x0;
  if (local_d0._M_head_impl != (Expression *)0x0) {
    (*((local_d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_d0._M_head_impl = (Expression *)0x0;
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  local_e0._8_8_ =
       (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_100,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             (local_e0 + 8));
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  auVar5 = local_100;
  local_100 = (undefined1  [8])0x0;
  _Var1._M_head_impl =
       (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar5;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_100 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_100 + 8))();
  }
  local_100 = (undefined1  [8])0x0;
  local_e0._0_8_ = this;
  if ((Expression *)local_e0._8_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_e0._8_8_ + 8))();
  }
  local_e0._8_8_ = 0;
  local_98 = context;
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar11);
  iVar9 = (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[6])(pEVar12);
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar11);
  iVar10 = (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[6])(pEVar12);
  if ((byte)((byte)iVar9 & (byte)iVar10) == 1) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar11);
  pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,1);
  pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar11);
  pLVar15 = &pEVar13->return_type;
  this_00 = &(local_c8->super_BaseScalarFunction).super_SimpleFunction.arguments;
  pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
  if ((byte)iVar9 == 0) {
    pLVar16 = &pEVar12->return_type;
    if ((byte)iVar10 == 0) {
      if (pvVar14 != pLVar16) {
        pvVar14->id_ = (pEVar12->return_type).id_;
        pvVar14->physical_type_ = (pEVar12->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar14->type_info_,&(pEVar12->return_type).type_info_);
      }
      pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
      _Var17._M_head_impl = (FunctionData *)local_e0._0_8_;
      if (pvVar14 != pLVar15) {
        pvVar14->id_ = (pEVar13->return_type).id_;
        pvVar14->physical_type_ = (pEVar13->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar14->type_info_,&(pEVar13->return_type).type_info_);
      }
      pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
      pLVar15 = ListType::GetChildType(pvVar14);
      pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
      pLVar16 = ListType::GetChildType(pvVar14);
      LogicalType::LogicalType((LogicalType *)local_100,SQLNULL);
      bVar8 = LogicalType::operator==(pLVar15,(LogicalType *)local_100);
      if (bVar8) {
LAB_01a7a5f5:
        pLVar15 = (LogicalType *)local_100;
      }
      else {
        LogicalType::LogicalType(&local_b0,SQLNULL);
        bVar8 = LogicalType::operator==(pLVar16,&local_b0);
        if (bVar8) {
          LogicalType::~LogicalType(&local_b0);
          goto LAB_01a7a5f5;
        }
        bVar8 = LogicalType::operator==(pLVar15,pLVar16);
        LogicalType::~LogicalType(&local_b0);
        LogicalType::~LogicalType((LogicalType *)local_100);
        if (bVar8) goto LAB_01a7a5ff;
        LogicalType::LogicalType(&local_b0);
        bVar8 = LogicalType::TryGetMaxLogicalType(local_98,pLVar15,pLVar16,&local_b0);
        if (!bVar8) {
          this_02 = (BinderException *)__cxa_allocate_exception(0x10);
          local_100 = (undefined1  [8])&aStack_f0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_100,
                     "\'%s\' cannot compare lists of different types: \'%s\' and \'%s\'","");
          local_90._0_8_ = local_90 + 0x10;
          pcVar3 = (local_c8->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                   _M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar3,
                     pcVar3 + (long)(((string *)
                                     &(local_c8->super_BaseScalarFunction).super_SimpleFunction.
                                      super_Function.name._M_string_length)->_M_dataplus)._M_p);
          LogicalType::ToString_abi_cxx11_(&local_50,pLVar15);
          LogicalType::ToString_abi_cxx11_(&local_70,pLVar16);
          BinderException::
          BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (this_02,(string *)local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     &local_50,&local_70);
          __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::LIST((LogicalType *)local_100,&local_b0);
        pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
        uVar7 = aStack_f0._M_allocated_capacity;
        peVar6 = local_f8;
        pvVar14->id_ = (LogicalTypeId)local_100[0];
        pvVar14->physical_type_ = local_100[1];
        uVar18 = *(undefined4 *)
                  &(pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar19 = *(undefined4 *)
                  ((long)&(pvVar14->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        pSVar4 = (ScalarFunction *)
                 (pvVar14->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar20 = *(undefined4 *)
                  &(pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar21 = *(undefined4 *)
                  ((long)&(pvVar14->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_f8 = (element_type *)0x0;
        aStack_f0._M_allocated_capacity = 0;
        p_Var2 = (pvVar14->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_c8 = pSVar4;
          uStack_c0 = uVar20;
          uStack_bc = uVar21;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar18 = local_c8._0_4_;
          uVar19 = local_c8._4_4_;
          uVar20 = uStack_c0;
          uVar21 = uStack_bc;
        }
        uVar7 = aStack_f0._M_allocated_capacity;
        local_f8 = (element_type *)CONCAT44(uVar19,uVar18);
        aStack_f0._M_allocated_capacity._4_4_ = uVar21;
        aStack_f0._M_allocated_capacity._0_4_ = uVar20;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        }
        LogicalType::~LogicalType((LogicalType *)local_100);
        LogicalType::LIST((LogicalType *)local_100,&local_b0);
        pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
        uVar7 = aStack_f0._M_allocated_capacity;
        peVar6 = local_f8;
        pvVar14->id_ = (LogicalTypeId)local_100[0];
        pvVar14->physical_type_ = local_100[1];
        uVar18 = *(undefined4 *)
                  &(pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar19 = *(undefined4 *)
                  ((long)&(pvVar14->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        pSVar4 = (ScalarFunction *)
                 (pvVar14->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar20 = *(undefined4 *)
                  &(pvVar14->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar21 = *(undefined4 *)
                  ((long)&(pvVar14->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_f8 = (element_type *)0x0;
        aStack_f0._M_allocated_capacity = 0;
        p_Var2 = (pvVar14->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
        (pvVar14->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_c8 = pSVar4;
          uStack_c0 = uVar20;
          uStack_bc = uVar21;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          uVar18 = local_c8._0_4_;
          uVar19 = local_c8._4_4_;
          uVar20 = uStack_c0;
          uVar21 = uStack_bc;
        }
        uVar7 = aStack_f0._M_allocated_capacity;
        local_f8 = (element_type *)CONCAT44(uVar19,uVar18);
        aStack_f0._M_allocated_capacity._4_4_ = uVar21;
        aStack_f0._M_allocated_capacity._0_4_ = uVar20;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        }
        LogicalType::~LogicalType((LogicalType *)local_100);
        pLVar15 = &local_b0;
      }
      LogicalType::~LogicalType(pLVar15);
      goto LAB_01a7a5ff;
    }
    if (pvVar14 != pLVar16) {
      pvVar14->id_ = (pEVar12->return_type).id_;
      pvVar14->physical_type_ = (pEVar12->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar14->type_info_,&(pEVar12->return_type).type_info_);
    }
    pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
    _Var17._M_head_impl = (FunctionData *)local_e0._0_8_;
    if (pvVar14 == pLVar16) goto LAB_01a7a5ff;
    pvVar14->id_ = (pEVar12->return_type).id_;
    pvVar14->physical_type_ = (pEVar12->return_type).physical_type_;
  }
  else {
    if (pvVar14 != pLVar15) {
      pvVar14->id_ = (pEVar13->return_type).id_;
      pvVar14->physical_type_ = (pEVar13->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar14->type_info_,&(pEVar13->return_type).type_info_);
    }
    pvVar14 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
    _Var17._M_head_impl = (FunctionData *)local_e0._0_8_;
    if (pvVar14 == pLVar15) goto LAB_01a7a5ff;
    pvVar14->id_ = (pEVar13->return_type).id_;
    pvVar14->physical_type_ = (pEVar13->return_type).physical_type_;
    pEVar12 = pEVar13;
  }
  _Var17._M_head_impl = (FunctionData *)local_e0._0_8_;
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
            (&pvVar14->type_info_,&(pEVar12->return_type).type_info_);
LAB_01a7a5ff:
  (_Var17._M_head_impl)->_vptr_FunctionData = (_func_int **)0x0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         _Var17._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListHasAnyOrAllBind(ClientContext &context, ScalarFunction &bound_function,
                                                    vector<unique_ptr<Expression>> &arguments) {

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));
	arguments[1] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[1]));

	const auto lhs_is_param = arguments[0]->HasParameter();
	const auto rhs_is_param = arguments[1]->HasParameter();

	if (lhs_is_param && rhs_is_param) {
		throw ParameterNotResolvedException();
	}

	const auto &lhs_list = arguments[0]->return_type;
	const auto &rhs_list = arguments[1]->return_type;

	if (lhs_is_param) {
		bound_function.arguments[0] = rhs_list;
		bound_function.arguments[1] = rhs_list;
		return nullptr;
	}
	if (rhs_is_param) {
		bound_function.arguments[0] = lhs_list;
		bound_function.arguments[1] = lhs_list;
		return nullptr;
	}

	bound_function.arguments[0] = lhs_list;
	bound_function.arguments[1] = rhs_list;

	const auto &lhs_child = ListType::GetChildType(bound_function.arguments[0]);
	const auto &rhs_child = ListType::GetChildType(bound_function.arguments[1]);

	if (lhs_child != LogicalType::SQLNULL && rhs_child != LogicalType::SQLNULL && lhs_child != rhs_child) {
		LogicalType common_child;
		if (!LogicalType::TryGetMaxLogicalType(context, lhs_child, rhs_child, common_child)) {
			throw BinderException("'%s' cannot compare lists of different types: '%s' and '%s'", bound_function.name,
			                      lhs_child.ToString(), rhs_child.ToString());
		}
		bound_function.arguments[0] = LogicalType::LIST(common_child);
		bound_function.arguments[1] = LogicalType::LIST(common_child);
	}

	return nullptr;
}